

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)49,_(unsigned_short)9>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint uVar1;
  uint *puVar2;
  
  puVar2 = *in;
  uVar1 = puVar2[2];
  out[9] = (ulong)(uVar1 & 0x3ff) << 0x27 | (ulong)puVar2[1] << 7 | (ulong)(*puVar2 >> 0x19);
  *in = puVar2 + 3;
  out[10] = (ulong)(puVar2[3] & 0x7ffffff) << 0x16 | (ulong)(uVar1 >> 10);
  Unroller<(unsigned_short)49,_(unsigned_short)11>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}